

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::BlueRoomFive(ItemTable *this)

{
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_130 [3];
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  Item local_100;
  ItemWrapper *local_d8;
  ItemWrapper *box;
  string local_c8 [32];
  Item local_a8;
  ItemWrapper *local_80;
  ItemWrapper *statue;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *StoneTablet;
  ItemTable *this_local;
  
  StoneTablet = (ItemWrapper *)this;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  statue._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Stone Tablet",&local_61);
  Item::Item(&local_40,(string *)local_60,TABLET);
  ItemWrapper::ItemWrapper(pIVar1,&local_40,B_ROOM5);
  statue._3_1_ = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_18 = pIVar1;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  box._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Stone ",(allocator *)((long)&box + 7));
  Item::Item(&local_a8,(string *)local_c8,STATUE);
  ItemWrapper::ItemWrapper(pIVar1,&local_a8,B_ROOM5);
  box._6_1_ = 0;
  Item::~Item(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&box + 7));
  local_80 = pIVar1;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  local_122 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"Stone Box",&local_121);
  Item::Item(&local_100,(string *)local_120,BOX);
  ItemWrapper::ItemWrapper(pIVar2,&local_100,HIDDEN);
  local_122 = 0;
  Item::~Item(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pIVar1 = local_18;
  local_130[2] = 0x20;
  local_d8 = pIVar2;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130 + 2);
  pIVar2 = local_80;
  *ppIVar3 = pIVar1;
  local_130[1] = 0x21;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130 + 1);
  pIVar1 = local_d8;
  *ppIVar3 = pIVar2;
  local_130[0] = BOX;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_130);
  *ppIVar3 = pIVar1;
  return;
}

Assistant:

void ItemTable::BlueRoomFive() {

    ItemWrapper * StoneTablet = new ItemWrapper(Item("Stone Tablet", TABLET), B_ROOM5);
    ItemWrapper * statue    = new ItemWrapper(Item("Stone ", STATUE), B_ROOM5);
    ItemWrapper * box       = new ItemWrapper(Item("Stone Box", BOX), HIDDEN);

    items[TABLET] = StoneTablet;
    items[STATUE] = statue;
    items[BOX]    = box;

}